

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

uint32 rw::gl3::getSizeNativeTexture(Texture *tex)

{
  int32 iVar1;
  uint32 uVar2;
  int32 extraout_EDX;
  int32 level;
  int32 extraout_EDX_00;
  uint local_1c;
  int32 i;
  int32 levels;
  uint32 size;
  Texture *tex_local;
  
  i = 0x74;
  iVar1 = Raster::getNumLevels(tex->raster);
  level = extraout_EDX;
  for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
    uVar2 = getLevelSize((gl3 *)tex->raster,(Raster *)(ulong)local_1c,level);
    i = uVar2 + 4 + i;
    level = extraout_EDX_00;
  }
  return i;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 32;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += 4 + getLevelSize(tex->raster, i);
	return size;
}